

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t x_data,double y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  long lVar2;
  double local_28;
  anon_union_16_2_67f50693_for_value local_20;
  
  lVar2 = x_data.value._8_8_;
  local_20.pointer.ptr = (char *)x_data.value._0_8_;
  local_28 = y_data;
  local_20._0_8_ = state;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 0x10),
                     *(idx_t *)(lVar2 + 0x20));
  if (bVar1) {
    bVar1 = GreaterThan::Operation<double>((double *)(this + 0x18),&local_28);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 8),
                         *(idx_t *)(lVar2 + 0x18));
      Assign<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
                ((ArgMinMaxState<duckdb::string_t,_double> *)this,(string_t *)&local_20.pointer,
                 &local_28,!bVar1);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}